

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcr.c
# Opt level: O0

void doreclaim(void)

{
  undefined1 local_84 [4];
  int local_80;
  MISCSTATS gcmisc;
  
  if (*GcDisabled_word == 0) {
    update_miscstats();
    memcpy(local_84,MiscStats,0x7c);
    *Reclaim_cnt_word = 0;
    if (*GcMess_word != 0) {
      flip_cursor();
    }
    dogc01();
    if (*GcMess_word != 0) {
      flip_cursor();
    }
    *Reclaim_cnt_word = *ReclaimMin_word;
    update_miscstats();
    MiscStats->gctime =
         (((MiscStats->gctime + MiscStats->totaltime) - local_80) + MiscStats->swapwaittime) -
         gcmisc.starttime;
  }
  return;
}

Assistant:

void doreclaim(void) {
  MISCSTATS gcmisc;

  if (*GcDisabled_word == NIL) {
    update_miscstats();
    gcmisc = *((MISCSTATS *)MiscStats);
    *Reclaim_cnt_word = NIL;
    if (*GcMess_word != NIL) flip_cursor();
    dogc01();
    if (*GcMess_word != NIL) flip_cursor();
    *Reclaim_cnt_word = *ReclaimMin_word;
    update_miscstats();
    MiscStats->gctime = MiscStats->gctime + MiscStats->totaltime - gcmisc.totaltime +
                        MiscStats->swapwaittime - gcmisc.swapwaittime;
  }
}